

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void snap_restoredata(GCtrace *T,ExitState *ex,SnapNo snapno,BloomFilter rfilt,IRRef ref,void *dst,
                     CTSize sz)

{
  IRIns *pIVar1;
  ulong uVar2;
  uint uVar3;
  IRIns *pIVar4;
  uint64_t tmp;
  IRIns local_38;
  
  uVar2 = (ulong)ref;
  pIVar1 = T->ir + uVar2;
  if (ref < 0x8000) {
    if ((byte)((pIVar1->field_1).o - 0x1b) < 2) {
      pIVar4 = (IRIns *)(ulong)(pIVar1->field_1).op12;
    }
    else {
      pIVar4 = pIVar1;
      if (sz == 8) {
        uVar3 = (pIVar1->field_1).op12;
LAB_0013abe5:
        local_38._4_4_ = 0;
        local_38.field_1.op12 = uVar3;
        pIVar4 = &local_38;
        goto LAB_0013ac30;
      }
    }
  }
  else {
    uVar3 = (uint)*(ushort *)((long)T->ir + uVar2 * 8 + 6);
    if ((rfilt >> (uVar2 & 0x3f) & 1) != 0) {
      uVar3 = snap_renameref(T,snapno,ref,uVar3);
    }
    if (uVar3 < 0x100) {
      if (0x7f < uVar3) {
        snap_restoredata(T,ex,snapno,rfilt,(uint)(pIVar1->field_0).op1,dst,4);
        *(double *)dst = (double)*dst;
        return;
      }
      pIVar4 = (IRIns *)(ex->fpr + (uVar3 - 0x10));
      if (uVar3 < 0x10) {
        pIVar4 = (IRIns *)(ex->gpr + uVar3);
      }
    }
    else {
      pIVar4 = (IRIns *)(ex->spill + (uVar3 >> 8));
      if (sz == 8) {
        uVar3._0_2_ = *(IROpT *)((long)pIVar1 + 4);
        uVar3._2_2_ = *(IRRef1 *)((long)pIVar1 + 6);
        if ((0x604208U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_0013ac30;
        uVar3 = (pIVar4->field_1).op12;
        goto LAB_0013abe5;
      }
    }
  }
  if (sz == 1) {
    *(undefined1 *)dst = *(undefined1 *)pIVar4;
    return;
  }
  if (sz != 8) {
    if (sz == 4) {
      *(IRRef2 *)dst = (pIVar4->field_1).op12;
      return;
    }
    *(IRRef1 *)dst = (pIVar4->field_0).op1;
    return;
  }
LAB_0013ac30:
  *(anon_struct_8_4_c535eab0_for_IRIns_0 *)dst = *(anon_struct_8_4_c535eab0_for_IRIns_0 *)pIVar4;
  return;
}

Assistant:

static void snap_restoredata(GCtrace *T, ExitState *ex,
			     SnapNo snapno, BloomFilter rfilt,
			     IRRef ref, void *dst, CTSize sz)
{
  IRIns *ir = &T->ir[ref];
  RegSP rs = ir->prev;
  int32_t *src;
  uint64_t tmp;
  if (irref_isk(ref)) {
    if (ir->o == IR_KNUM || ir->o == IR_KINT64) {
      src = mref(ir->ptr, int32_t);
    } else if (sz == 8) {
      tmp = (uint64_t)(uint32_t)ir->i;
      src = (int32_t *)&tmp;
    } else {
      src = &ir->i;
    }
  } else {
    if (LJ_UNLIKELY(bloomtest(rfilt, ref)))
      rs = snap_renameref(T, snapno, ref, rs);
    if (ra_hasspill(regsp_spill(rs))) {
      src = &ex->spill[regsp_spill(rs)];
      if (sz == 8 && !irt_is64(ir->t)) {
	tmp = (uint64_t)(uint32_t)*src;
	src = (int32_t *)&tmp;
      }
    } else {
      Reg r = regsp_reg(rs);
      if (ra_noreg(r)) {
	/* Note: this assumes CNEWI is never used for SOFTFP split numbers. */
	lua_assert(sz == 8 && ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT);
	snap_restoredata(T, ex, snapno, rfilt, ir->op1, dst, 4);
	*(lua_Number *)dst = (lua_Number)*(int32_t *)dst;
	return;
      }
      src = (int32_t *)&ex->gpr[r-RID_MIN_GPR];
#if !LJ_SOFTFP
      if (r >= RID_MAX_GPR) {
	src = (int32_t *)&ex->fpr[r-RID_MIN_FPR];
#if LJ_TARGET_PPC
	if (sz == 4) {  /* PPC FPRs are always doubles. */
	  *(float *)dst = (float)*(double *)src;
	  return;
	}
#else
	if (LJ_BE && sz == 4) src++;
#endif
      }
#endif
    }
  }
  lua_assert(sz == 1 || sz == 2 || sz == 4 || sz == 8);
  if (sz == 4) *(int32_t *)dst = *src;
  else if (sz == 8) *(int64_t *)dst = *(int64_t *)src;
  else if (sz == 1) *(int8_t *)dst = (int8_t)*src;
  else *(int16_t *)dst = (int16_t)*src;
}